

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

XMLAttDef * __thiscall
xercesc_4_0::DTDScanner::scanAttDef(DTDScanner *this,DTDElementDecl *parentElem,XMLBuffer *bufToUse)

{
  uint uVar1;
  XMLScanner *pXVar2;
  bool bVar3;
  int iVar4;
  ValSchemes VVar5;
  AttTypes AVar6;
  DefAttTypes DVar7;
  XMLCh *pXVar8;
  DTDAttDef *pDVar9;
  XMLCh *text2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLValidator *pXVar10;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  BaseRefVectorOf<char16_t> *this_00;
  XMLSize_t XVar11;
  char16_t *pcVar12;
  bool local_133;
  bool local_132;
  bool local_131;
  XMLSize_t size;
  BaseRefVectorOf<char16_t> *enumVector;
  XMLCh aXStack_88 [3];
  bool ok;
  XMLCh fgDefault [8];
  XMLCh fgPreserve [9];
  XMLCh local_58 [4];
  XMLCh fgXMLSpace [10];
  bool isIgnored;
  DTDAttDef *local_30;
  DTDAttDef *decl;
  XMLBuffer *bufToUse_local;
  DTDElementDecl *parentElem_local;
  DTDScanner *this_local;
  
  checkForPERef(this,false,true);
  bVar3 = ReaderMgr::getName(this->fReaderMgr,bufToUse);
  if (!bVar3) {
    XMLScanner::emitError(this->fScanner,ExpectedAttrName);
    return (XMLAttDef *)0x0;
  }
  pXVar8 = XMLBuffer::getRawBuffer(bufToUse);
  pDVar9 = DTDElementDecl::getAttDef(parentElem,pXVar8);
  if (pDVar9 == (DTDAttDef *)0x0) {
    local_30 = (DTDAttDef *)XMemory::operator_new(0x48,this->fGrammarPoolMemoryManager);
    pXVar8 = XMLBuffer::getRawBuffer(bufToUse);
    DTDAttDef::DTDAttDef(local_30,pXVar8,AttTypes_Min,Implied,this->fGrammarPoolMemoryManager);
    uVar1 = this->fNextAttrId;
    this->fNextAttrId = uVar1 + 1;
    XMLAttDef::setId((XMLAttDef *)local_30,(ulong)uVar1);
    bVar3 = isReadingExternalEntity(this);
    XMLAttDef::setExternalAttDeclaration((XMLAttDef *)local_30,bVar3);
    DTDElementDecl::addAttDef(parentElem,local_30);
  }
  else {
    pXVar2 = this->fScanner;
    pXVar8 = XMLBuffer::getRawBuffer(bufToUse);
    text2 = XMLElementDecl::getFullName(&parentElem->super_XMLElementDecl);
    XMLScanner::emitError(pXVar2,AttListAlreadyExists,pXVar8,text2,(XMLCh *)0x0,(XMLCh *)0x0);
    if (this->fDumAttDef == (DTDAttDef *)0x0) {
      pDVar9 = (DTDAttDef *)XMemory::operator_new(0x48,this->fMemoryManager);
      DTDAttDef::DTDAttDef(pDVar9,this->fMemoryManager);
      this->fDumAttDef = pDVar9;
      uVar1 = this->fNextAttrId;
      this->fNextAttrId = uVar1 + 1;
      XMLAttDef::setId(&this->fDumAttDef->super_XMLAttDef,(ulong)uVar1);
    }
    pDVar9 = this->fDumAttDef;
    pXVar8 = XMLBuffer::getRawBuffer(bufToUse);
    DTDAttDef::setName(pDVar9,pXVar8);
    local_30 = this->fDumAttDef;
  }
  fgXMLSpace[9]._1_1_ = local_30 == this->fDumAttDef;
  bVar3 = checkForPERef(this,false,true);
  if (!bVar3) {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  bVar3 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgCDATAString);
  if (bVar3) {
    XMLAttDef::setType(&local_30->super_XMLAttDef,AttTypes_Min);
  }
  else {
    bVar3 = ReaderMgr::skippedString(this->fReaderMgr,L"ID");
    if (bVar3) {
      bVar3 = ReaderMgr::skippedString(this->fReaderMgr,L"REF");
      if (bVar3) {
        bVar3 = ReaderMgr::skippedChar(this->fReaderMgr,L'S');
        if (bVar3) {
          XMLAttDef::setType(&local_30->super_XMLAttDef,IDRefs);
        }
        else {
          XMLAttDef::setType(&local_30->super_XMLAttDef,IDRef);
        }
      }
      else {
        XMLAttDef::setType(&local_30->super_XMLAttDef,ID);
      }
    }
    else {
      bVar3 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgEntitString);
      if (bVar3) {
        bVar3 = ReaderMgr::skippedChar(this->fReaderMgr,L'Y');
        if (bVar3) {
          XMLAttDef::setType(&local_30->super_XMLAttDef,Entity);
        }
        else {
          bVar3 = ReaderMgr::skippedString(this->fReaderMgr,L"IES");
          if (!bVar3) {
            pXVar2 = this->fScanner;
            iVar4 = (*(local_30->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])();
            pXVar8 = XMLElementDecl::getFullName(&parentElem->super_XMLElementDecl);
            XMLScanner::emitError
                      (pXVar2,ExpectedAttributeType,(XMLCh *)CONCAT44(extraout_var,iVar4),pXVar8,
                       (XMLCh *)0x0,(XMLCh *)0x0);
            return (XMLAttDef *)0x0;
          }
          XMLAttDef::setType(&local_30->super_XMLAttDef,Entities);
        }
      }
      else {
        bVar3 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgNmTokenString);
        if (bVar3) {
          bVar3 = ReaderMgr::skippedChar(this->fReaderMgr,L'S');
          if (bVar3) {
            XMLAttDef::setType(&local_30->super_XMLAttDef,NmTokens);
          }
          else {
            XMLAttDef::setType(&local_30->super_XMLAttDef,NmToken);
          }
        }
        else {
          bVar3 = ReaderMgr::skippedString(this->fReaderMgr,(XMLCh *)XMLUni::fgNotationString);
          if (bVar3) {
            bVar3 = checkForPERef(this,false,true);
            if (!bVar3) {
              XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
            }
            XMLAttDef::setType(&local_30->super_XMLAttDef,Notation);
            bVar3 = scanEnumeration(this,local_30,bufToUse,true);
            if (!bVar3) {
              return (XMLAttDef *)0x0;
            }
            pXVar8 = XMLBuffer::getRawBuffer(bufToUse);
            XMLAttDef::setEnumeration(&local_30->super_XMLAttDef,pXVar8);
          }
          else {
            bVar3 = ReaderMgr::skippedChar(this->fReaderMgr,L'(');
            if (!bVar3) {
              pXVar2 = this->fScanner;
              iVar4 = (*(local_30->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])();
              pXVar8 = XMLElementDecl::getFullName(&parentElem->super_XMLElementDecl);
              XMLScanner::emitError
                        (pXVar2,ExpectedAttributeType,(XMLCh *)CONCAT44(extraout_var_00,iVar4),
                         pXVar8,(XMLCh *)0x0,(XMLCh *)0x0);
              return (XMLAttDef *)0x0;
            }
            XMLAttDef::setType(&local_30->super_XMLAttDef,Enumeration);
            bVar3 = scanEnumeration(this,local_30,bufToUse,false);
            if (!bVar3) {
              return (XMLAttDef *)0x0;
            }
            pXVar8 = XMLBuffer::getRawBuffer(bufToUse);
            XMLAttDef::setEnumeration(&local_30->super_XMLAttDef,pXVar8);
          }
        }
      }
    }
  }
  bVar3 = checkForPERef(this,false,true);
  if (!bVar3) {
    XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
  }
  scanDefaultDecl(this,local_30);
  VVar5 = XMLScanner::getValidationScheme(this->fScanner);
  if (VVar5 != Val_Always) goto LAB_003f345e;
  AVar6 = XMLAttDef::getType(&local_30->super_XMLAttDef);
  if (((AVar6 == ID) &&
      (DVar7 = XMLAttDef::getDefaultType(&local_30->super_XMLAttDef), DVar7 != Implied)) &&
     (DVar7 = XMLAttDef::getDefaultType(&local_30->super_XMLAttDef), DVar7 != Required)) {
    pXVar10 = XMLScanner::getValidator(this->fScanner);
    iVar4 = (*(local_30->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])();
    XMLValidator::emitError
              (pXVar10,BadIDAttrDefType,(XMLCh *)CONCAT44(extraout_var_01,iVar4),(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0);
  }
  builtin_memcpy(local_58,L"xml:",8);
  builtin_memcpy(fgXMLSpace,L"space",0xc);
  iVar4 = (*(local_30->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])();
  bVar3 = XMLString::equals((XMLCh *)CONCAT44(extraout_var_02,iVar4),local_58);
  if (!bVar3) goto LAB_003f345e;
  builtin_memcpy(fgDefault + 4,L"pres",8);
  _aXStack_88 = 0x61006600650064;
  builtin_memcpy(fgDefault,L"ult",8);
  enumVector._7_1_ = false;
  AVar6 = XMLAttDef::getType(&local_30->super_XMLAttDef);
  if (AVar6 == Enumeration) {
    pXVar8 = XMLAttDef::getEnumeration(&local_30->super_XMLAttDef);
    this_00 = XMLString::tokenizeString(pXVar8,this->fMemoryManager);
    XVar11 = BaseRefVectorOf<char16_t>::size(this_00);
    if (XVar11 == 1) {
      pcVar12 = BaseRefVectorOf<char16_t>::elementAt(this_00,0);
      bVar3 = XMLString::equals(pcVar12,aXStack_88);
      local_131 = true;
      if (!bVar3) {
        pcVar12 = BaseRefVectorOf<char16_t>::elementAt(this_00,0);
        bVar3 = XMLString::equals(pcVar12,fgDefault + 4);
        local_131 = true;
        if (!bVar3) goto LAB_003f3331;
      }
    }
    else {
LAB_003f3331:
      if (XVar11 == 2) {
        pcVar12 = BaseRefVectorOf<char16_t>::elementAt(this_00,0);
        bVar3 = XMLString::equals(pcVar12,aXStack_88);
        if (bVar3) {
          pcVar12 = BaseRefVectorOf<char16_t>::elementAt(this_00,1);
          bVar3 = XMLString::equals(pcVar12,fgDefault + 4);
          local_131 = true;
          if (bVar3) goto LAB_003f3403;
        }
      }
      local_132 = false;
      if (XVar11 == 2) {
        pcVar12 = BaseRefVectorOf<char16_t>::elementAt(this_00,1);
        bVar3 = XMLString::equals(pcVar12,aXStack_88);
        local_133 = false;
        if (bVar3) {
          pcVar12 = BaseRefVectorOf<char16_t>::elementAt(this_00,0);
          local_133 = XMLString::equals(pcVar12,fgDefault + 4);
        }
        local_132 = local_133;
      }
      local_131 = local_132;
    }
LAB_003f3403:
    enumVector._7_1_ = local_131;
    if (this_00 != (BaseRefVectorOf<char16_t> *)0x0) {
      (*this_00->_vptr_BaseRefVectorOf[1])();
    }
  }
  if (enumVector._7_1_ == false) {
    pXVar10 = XMLScanner::getValidator(this->fScanner);
    XMLValidator::emitError(pXVar10,IllegalXMLSpace);
  }
LAB_003f345e:
  if (this->fDocTypeHandler != (DocTypeHandler *)0x0) {
    (*this->fDocTypeHandler->_vptr_DocTypeHandler[2])
              (this->fDocTypeHandler,parentElem,local_30,(ulong)(fgXMLSpace[9]._1_1_ & 1));
  }
  return &local_30->super_XMLAttDef;
}

Assistant:

XMLAttDef*
DTDScanner::scanAttDef(DTDElementDecl& parentElem, XMLBuffer& bufToUse)
{
    // Check for PE ref or optional whitespace
    checkForPERef(false, true);

    // Get the name of the attribute
    if (!fReaderMgr->getName(bufToUse))
    {
        fScanner->emitError(XMLErrs::ExpectedAttrName);
        return 0;
    }

    //
    //  Look up this attribute in the parent element's attribute list. If
    //  it already exists, then use the dummy.
    //
    DTDAttDef* decl = parentElem.getAttDef(bufToUse.getRawBuffer());
    if (decl)
    {
        // It already exists, so put out a warning
        fScanner->emitError
        (
            XMLErrs::AttListAlreadyExists
            , bufToUse.getRawBuffer()
            , parentElem.getFullName()
        );

        // Use the dummy decl to parse into and set its name to the name we got
        if (!fDumAttDef)
        {
            fDumAttDef = new (fMemoryManager) DTDAttDef(fMemoryManager);
            fDumAttDef->setId(fNextAttrId++);
        }
        fDumAttDef->setName(bufToUse.getRawBuffer());
        decl = fDumAttDef;
    }
     else
    {
        //
        //  It does not already exist so create a new one, give it the next
        //  available unique id, and add it
        //
        decl = new (fGrammarPoolMemoryManager) DTDAttDef
        (
            bufToUse.getRawBuffer()
            , XMLAttDef::CData
            , XMLAttDef::Implied
            , fGrammarPoolMemoryManager
        );
        decl->setId(fNextAttrId++);
        decl->setExternalAttDeclaration(isReadingExternalEntity());
        parentElem.addAttDef(decl);
    }

    // Set a flag to indicate whether we are doing a dummy parse
    const bool isIgnored = (decl == fDumAttDef);

    // Space is required here, so check for PE ref, and require space
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    //
    //  Next has to be one of the attribute type strings. This tells us what
    //  is to follow.
    //
    if (fReaderMgr->skippedString(XMLUni::fgCDATAString))
    {
        decl->setType(XMLAttDef::CData);
    }
     else if (fReaderMgr->skippedString(XMLUni::fgIDString))
    {
        if (!fReaderMgr->skippedString(XMLUni::fgRefString))
            decl->setType(XMLAttDef::ID);
        else if (!fReaderMgr->skippedChar(chLatin_S))
            decl->setType(XMLAttDef::IDRef);
        else
            decl->setType(XMLAttDef::IDRefs);
    }
     else if (fReaderMgr->skippedString(XMLUni::fgEntitString))
    {
        if (fReaderMgr->skippedChar(chLatin_Y))
        {
            decl->setType(XMLAttDef::Entity);
        }
         else if (fReaderMgr->skippedString(XMLUni::fgIESString))
        {
            decl->setType(XMLAttDef::Entities);
        }
         else
        {
            fScanner->emitError
            (
                XMLErrs::ExpectedAttributeType
                , decl->getFullName()
                , parentElem.getFullName()
            );
            return 0;
        }
    }
     else if (fReaderMgr->skippedString(XMLUni::fgNmTokenString))
    {
        if (fReaderMgr->skippedChar(chLatin_S))
            decl->setType(XMLAttDef::NmTokens);
        else
            decl->setType(XMLAttDef::NmToken);
    }
     else if (fReaderMgr->skippedString(XMLUni::fgNotationString))
    {
        // Check for PE ref and require space
        if (!checkForPERef(false, true))
            fScanner->emitError(XMLErrs::ExpectedWhitespace);

        decl->setType(XMLAttDef::Notation);
        if (!scanEnumeration(*decl, bufToUse, true))
            return 0;

        // Set the value as the enumeration for this decl
        decl->setEnumeration(bufToUse.getRawBuffer());
    }
     else if (fReaderMgr->skippedChar(chOpenParen))
    {
        decl->setType(XMLAttDef::Enumeration);
        if (!scanEnumeration(*decl, bufToUse, false))
            return 0;

        // Set the value as the enumeration for this decl
        decl->setEnumeration(bufToUse.getRawBuffer());
    }
     else
    {
        fScanner->emitError
        (
            XMLErrs::ExpectedAttributeType
            , decl->getFullName()
            , parentElem.getFullName()
        );
        return 0;
    }

    // Space is required here, so check for PE ref, and require space
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // And then scan for the optional default value declaration
    scanDefaultDecl(*decl);

    // If validating, then do a couple of validation constraints
    if (fScanner->getValidationScheme() == XMLScanner::Val_Always)
    {
        if (decl->getType() == XMLAttDef::ID)
        {
            if ((decl->getDefaultType() != XMLAttDef::Implied)
            &&  (decl->getDefaultType() != XMLAttDef::Required))
            {
                fScanner->getValidator()->emitError(XMLValid::BadIDAttrDefType, decl->getFullName());
            }
        }

        // if attdef is xml:space, check correct enumeration (default|preserve)
        const XMLCh fgXMLSpace[] = { chLatin_x, chLatin_m, chLatin_l, chColon, chLatin_s, chLatin_p, chLatin_a, chLatin_c, chLatin_e, chNull };

        if (XMLString::equals(decl->getFullName(),fgXMLSpace)) {
            const XMLCh fgPreserve[] = { chLatin_p, chLatin_r, chLatin_e, chLatin_s, chLatin_e, chLatin_r, chLatin_v, chLatin_e, chNull };
            const XMLCh fgDefault[] = { chLatin_d, chLatin_e, chLatin_f, chLatin_a, chLatin_u, chLatin_l, chLatin_t, chNull };
            bool ok = false;
            if (decl->getType() == XMLAttDef::Enumeration) {
                BaseRefVectorOf<XMLCh>* enumVector = XMLString::tokenizeString(decl->getEnumeration(), fMemoryManager);
                XMLSize_t size = enumVector->size();
                ok = (size == 1 &&
                     (XMLString::equals(enumVector->elementAt(0), fgDefault) ||
                      XMLString::equals(enumVector->elementAt(0), fgPreserve))) ||
                     (size == 2 &&
                     (XMLString::equals(enumVector->elementAt(0), fgDefault) &&
                      XMLString::equals(enumVector->elementAt(1), fgPreserve))) ||
                     (size == 2 &&
                     (XMLString::equals(enumVector->elementAt(1), fgDefault) &&
                      XMLString::equals(enumVector->elementAt(0), fgPreserve)));
                delete enumVector;
            }
            if (!ok)
                fScanner->getValidator()->emitError(XMLValid::IllegalXMLSpace);
        }
    }

    // If we have a doc type handler, tell it about this attdef.
    if (fDocTypeHandler)
        fDocTypeHandler->attDef(parentElem, *decl, isIgnored);
    return decl;
}